

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMipSolverData.cpp
# Opt level: O3

Status __thiscall HighsMipSolverData::evaluateRootLp(HighsMipSolverData *this)

{
  HighsDomain *this_00;
  StabilizerOrbits *this_01;
  long lVar1;
  HighsMipSolver *pHVar2;
  bool bVar3;
  byte bVar4;
  bool bVar5;
  Status SVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  
  this_00 = &this->domain;
  while( true ) {
    HighsDomain::propagate(this_00);
    this_01 = (this->globalOrbits).
              super___shared_ptr<const_StabilizerOrbits,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    bVar4 = (this->domain).infeasible_;
    if ((this_01 != (StabilizerOrbits *)0x0) && ((bVar4 & 1) == 0)) {
      StabilizerOrbits::orbitalFixing(this_01,this_00);
      bVar4 = (this->domain).infeasible_;
    }
    if ((bVar4 & 1) != 0) break;
    if ((this->domain).changedcols_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start !=
        (this->domain).changedcols_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      removeFixedIndices(this);
      HighsLpRelaxation::flushDomain(&this->lp,this_00,false);
LAB_002ba89f:
      lVar1 = (this->lp).numlpiters;
      SVar6 = HighsLpRelaxation::resolveLp(&this->lp,this_00);
      this->total_lp_iterations = this->total_lp_iterations + ((this->lp).numlpiters - lVar1);
      this->avgrootlpiters = (this->lp).avgSolveIters;
      if (SVar6 != kOptimal) {
        if (SVar6 == kUnbounded) {
          pHVar2 = this->mipsolver;
          pHVar2->modelstatus_ =
               ((pHVar2->solution_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start !=
               (pHVar2->solution_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish) + kUnboundedOrInfeasible;
          SVar6 = kUnbounded;
          goto LAB_002baa84;
        }
        bVar3 = true;
        goto LAB_002ba940;
      }
      SVar6 = kOptimal;
      bVar3 = true;
      if (((this->lp).fractionalints.
           super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
           _M_impl.super__Vector_impl_data._M_start !=
           (this->lp).fractionalints.
           super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
           _M_impl.super__Vector_impl_data._M_finish) ||
         (bVar5 = addIncumbent(this,&(this->lp).lpsolver.solution_.col_value,(this->lp).objective,8,
                               true,false), !bVar5)) goto LAB_002ba949;
      pHVar2 = this->mipsolver;
      pHVar2->modelstatus_ = kOptimal;
      dVar7 = this->lower_bound;
      dVar9 = this->upper_bound;
      this->lower_bound = dVar9;
      SVar6 = kInfeasible;
      if (pHVar2->submip != false) goto LAB_002baa84;
      dVar8 = dVar9;
      if ((dVar9 == dVar7) && (!NAN(dVar9) && !NAN(dVar7))) goto LAB_002baa84;
      goto LAB_002baa57;
    }
    if ((this->lp).lpsolver.model_status_ == kMin) goto LAB_002ba89f;
    SVar6 = (this->lp).status;
    bVar3 = false;
LAB_002ba940:
    if (SVar6 == kInfeasible) break;
LAB_002ba949:
    if (((this->lp).status - kOptimal & 0xfffffffd) == 0) {
      dVar7 = this->lower_bound;
      dVar9 = (this->lp).objective;
      dVar8 = dVar7;
      if (dVar7 <= dVar9) {
        dVar8 = dVar9;
      }
      this->lower_bound = dVar8;
      if (this->mipsolver->submip == false) {
        if ((dVar8 != dVar7) || (NAN(dVar8) || NAN(dVar7))) {
          updatePrimalDualIntegral(this,dVar7,dVar8,this->upper_bound,this->upper_bound,false,false)
          ;
        }
      }
      if ((bVar3) &&
         (HighsRedcostFixing::addRootRedcost
                    (&this->redcostfixing,this->mipsolver,&(this->lp).lpsolver.solution_.col_dual,
                     (this->lp).objective), this->upper_limit < INFINITY)) {
        HighsRedcostFixing::propagateRootRedcost(&this->redcostfixing,this->mipsolver);
      }
    }
    if (this->optimality_limit <= this->lower_bound && this->lower_bound != this->optimality_limit)
    {
      SVar6 = kInfeasible;
      goto LAB_002baa84;
    }
    if ((this->domain).changedcols_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (this->domain).changedcols_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      return SVar6;
    }
  }
  dVar8 = this->upper_bound;
  dVar9 = dVar8;
  if (dVar8 == INFINITY) {
    dVar9 = INFINITY;
  }
  dVar7 = this->lower_bound;
  this->lower_bound = dVar9;
  SVar6 = kInfeasible;
  if (this->mipsolver->submip != false) goto LAB_002baa84;
  if ((dVar9 == dVar7) && (!NAN(dVar9) && !NAN(dVar7))) goto LAB_002baa84;
LAB_002baa57:
  SVar6 = kInfeasible;
  updatePrimalDualIntegral(this,dVar7,dVar9,dVar8,dVar8,false,false);
LAB_002baa84:
  (this->pruned_treeweight).hi = 1.0;
  (this->pruned_treeweight).lo = 0.0;
  this->num_nodes = this->num_nodes + 1;
  this->num_leaves = this->num_leaves + 1;
  return SVar6;
}

Assistant:

HighsLpRelaxation::Status HighsMipSolverData::evaluateRootLp() {
  do {
    domain.propagate();

    if (globalOrbits && !domain.infeasible())
      globalOrbits->orbitalFixing(domain);

    if (domain.infeasible()) {
      double prev_lower_bound = lower_bound;

      lower_bound = std::min(kHighsInf, upper_bound);

      bool bound_change = lower_bound != prev_lower_bound;
      if (!mipsolver.submip && bound_change)
        updatePrimalDualIntegral(prev_lower_bound, lower_bound, upper_bound,
                                 upper_bound);
      pruned_treeweight = 1.0;
      num_nodes += 1;
      num_leaves += 1;
      return HighsLpRelaxation::Status::kInfeasible;
    }

    bool lpBoundsChanged = false;
    if (!domain.getChangedCols().empty()) {
      lpBoundsChanged = true;
      removeFixedIndices();
      lp.flushDomain(domain);
    }

    bool lpWasSolved = false;
    HighsLpRelaxation::Status status;
    if (lpBoundsChanged ||
        lp.getLpSolver().getModelStatus() == HighsModelStatus::kNotset) {
      int64_t lpIters = -lp.getNumLpIterations();
      status = lp.resolveLp(&domain);
      lpIters += lp.getNumLpIterations();
      total_lp_iterations += lpIters;
      avgrootlpiters = lp.getAvgSolveIters();
      lpWasSolved = true;

      if (status == HighsLpRelaxation::Status::kUnbounded) {
        if (mipsolver.solution_.empty())
          mipsolver.modelstatus_ = HighsModelStatus::kUnboundedOrInfeasible;
        else
          mipsolver.modelstatus_ = HighsModelStatus::kUnbounded;

        pruned_treeweight = 1.0;
        num_nodes += 1;
        num_leaves += 1;
        return status;
      }

      if (status == HighsLpRelaxation::Status::kOptimal &&
          lp.getFractionalIntegers().empty() &&
          addIncumbent(lp.getLpSolver().getSolution().col_value,
                       lp.getObjective(), kSolutionSourceEvaluateNode)) {
        mipsolver.modelstatus_ = HighsModelStatus::kOptimal;

        double prev_lower_bound = lower_bound;

        lower_bound = upper_bound;

        bool bound_change = lower_bound != prev_lower_bound;
        if (!mipsolver.submip && bound_change)
          updatePrimalDualIntegral(prev_lower_bound, lower_bound, upper_bound,
                                   upper_bound);
        pruned_treeweight = 1.0;
        num_nodes += 1;
        num_leaves += 1;
        return HighsLpRelaxation::Status::kInfeasible;
      }
    } else
      status = lp.getStatus();

    if (status == HighsLpRelaxation::Status::kInfeasible) {
      double prev_lower_bound = lower_bound;

      lower_bound = std::min(kHighsInf, upper_bound);

      bool bound_change = lower_bound != prev_lower_bound;
      if (!mipsolver.submip && bound_change)
        updatePrimalDualIntegral(prev_lower_bound, lower_bound, upper_bound,
                                 upper_bound);
      pruned_treeweight = 1.0;
      num_nodes += 1;
      num_leaves += 1;
      return status;
    }

    if (lp.unscaledDualFeasible(lp.getStatus())) {
      double prev_lower_bound = lower_bound;

      lower_bound = std::max(lp.getObjective(), lower_bound);

      bool bound_change = lower_bound != prev_lower_bound;
      if (!mipsolver.submip && bound_change)
        updatePrimalDualIntegral(prev_lower_bound, lower_bound, upper_bound,
                                 upper_bound);

      if (lpWasSolved) {
        redcostfixing.addRootRedcost(mipsolver,
                                     lp.getLpSolver().getSolution().col_dual,
                                     lp.getObjective());
        if (upper_limit != kHighsInf)
          redcostfixing.propagateRootRedcost(mipsolver);
      }
    }

    if (lower_bound > optimality_limit) {
      pruned_treeweight = 1.0;
      num_nodes += 1;
      num_leaves += 1;
      return HighsLpRelaxation::Status::kInfeasible;
    }

    if (domain.getChangedCols().empty()) return status;
  } while (true);
}